

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3BinaryCompareCollSeq(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  long in_RDX;
  long in_RSI;
  CollSeq *pColl;
  undefined8 local_20;
  
  if ((*(uint *)(in_RSI + 4) & 0x200) == 0) {
    if ((in_RDX == 0) || ((*(uint *)(in_RDX + 4) & 0x200) == 0)) {
      local_20 = sqlite3ExprCollSeq((Parse *)pRight,(Expr *)pColl);
      if (local_20 == (CollSeq *)0x0) {
        local_20 = sqlite3ExprCollSeq((Parse *)pRight,(Expr *)pColl);
      }
    }
    else {
      local_20 = sqlite3ExprCollSeq((Parse *)pRight,(Expr *)pColl);
    }
  }
  else {
    local_20 = sqlite3ExprCollSeq((Parse *)pRight,(Expr *)pColl);
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3BinaryCompareCollSeq(
  Parse *pParse,
  const Expr *pLeft,
  const Expr *pRight
){
  CollSeq *pColl;
  assert( pLeft );
  if( pLeft->flags & EP_Collate ){
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
  }else if( pRight && (pRight->flags & EP_Collate)!=0 ){
    pColl = sqlite3ExprCollSeq(pParse, pRight);
  }else{
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
    if( !pColl ){
      pColl = sqlite3ExprCollSeq(pParse, pRight);
    }
  }
  return pColl;
}